

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::ExpandLinkItems
          (cmGeneratorTarget *this,string *prop,string *value,string *config,
          cmGeneratorTarget *headTarget,bool usage_requirements_only,
          vector<cmLinkItem,_std::allocator<cmLinkItem>_> *items,bool *hadHeadSensitiveCondition)

{
  cmCompiledGeneratorExpression *pcVar1;
  Snapshot snapshot;
  char *pcVar2;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libs;
  cmGeneratorExpressionDAGChecker dagChecker;
  cmGeneratorExpression ge;
  allocator local_1d9;
  auto_ptr<cmCompiledGeneratorExpression> local_1d8;
  cmGeneratorExpression local_1d0;
  string *local_188;
  cmGeneratorTarget *local_180;
  string *local_178;
  string local_170;
  undefined1 local_150 [72];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_108;
  cmListFileBacktrace local_d0;
  bool local_8c;
  cmGeneratorExpression local_88;
  Snapshot local_48;
  
  local_188 = config;
  local_180 = headTarget;
  local_178 = value;
  cmState::Snapshot::Snapshot(&local_48,(cmState *)0x0);
  pcVar1 = (cmCompiledGeneratorExpression *)&local_1d0.Backtrace.Context.Name.field_2;
  local_1d0.Backtrace.Context.Name._M_string_length = 0;
  local_1d0.Backtrace.Context.Name.field_2._M_local_buf[0] = '\0';
  local_1d0.Backtrace.Context.Line = 0;
  snapshot.Position.Tree = local_48.Position.Tree;
  snapshot.State = local_48.State;
  snapshot.Position.Position = local_48.Position.Position;
  local_1d0.Backtrace.Context.Name._M_dataplus._M_p = (pointer)pcVar1;
  cmListFileBacktrace::cmListFileBacktrace
            ((cmListFileBacktrace *)local_150,snapshot,(cmCommandContext *)&local_1d0);
  cmGeneratorExpression::cmGeneratorExpression(&local_88,(cmListFileBacktrace *)local_150);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_150);
  if ((cmCompiledGeneratorExpression *)local_1d0.Backtrace.Context.Name._M_dataplus._M_p != pcVar1)
  {
    operator_delete(local_1d0.Backtrace.Context.Name._M_dataplus._M_p,
                    CONCAT71(local_1d0.Backtrace.Context.Name.field_2._M_allocated_capacity._1_7_,
                             local_1d0.Backtrace.Context.Name.field_2._M_local_buf[0]) + 1);
  }
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_150,&this->Target->Name,prop,
             (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
  if (usage_requirements_only) {
    local_8c = true;
  }
  local_1d0.Backtrace.Snapshot.State = (cmState *)0x0;
  local_1d0.Backtrace.Snapshot.Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)0x0;
  local_1d0.Backtrace.Snapshot.Position.Position = 0;
  cmGeneratorExpression::Parse(&local_1d0,(string *)&local_88);
  local_1d8.x_ = (cmCompiledGeneratorExpression *)local_1d0.Backtrace.Context.Name._M_dataplus._M_p;
  local_1d0.Backtrace.Context.Name._M_dataplus._M_p = (pointer)0x0;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&local_1d0);
  local_170._M_string_length = 0;
  local_170.field_2._M_local_buf[0] = '\0';
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  pcVar2 = cmCompiledGeneratorExpression::Evaluate
                     (local_1d8.x_,this->LocalGenerator,local_188,false,local_180,this,
                      (cmGeneratorExpressionDAGChecker *)local_150,&local_170);
  std::__cxx11::string::string((string *)&local_1d0,pcVar2,&local_1d9);
  cmSystemTools::ExpandListArgument
            ((string *)&local_1d0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1d0.Backtrace.Snapshot,false);
  if ((cmCompiledGeneratorExpression *)local_1d0.Backtrace.Context.Name._M_dataplus._M_p != pcVar1)
  {
    operator_delete(local_1d0.Backtrace.Context.Name._M_dataplus._M_p,
                    CONCAT71(local_1d0.Backtrace.Context.Name.field_2._M_allocated_capacity._1_7_,
                             local_1d0.Backtrace.Context.Name.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,
                    CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                             local_170.field_2._M_local_buf[0]) + 1);
  }
  LookupLinkItems(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_1d0.Backtrace.Snapshot,items);
  *hadHeadSensitiveCondition = (local_1d8.x_)->HadHeadSensitiveCondition;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_1d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1d0.Backtrace.Snapshot);
  cmListFileBacktrace::~cmListFileBacktrace(&local_d0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_108);
  if ((cmState *)local_150._40_8_ != (cmState *)(local_150 + 0x38)) {
    operator_delete((void *)local_150._40_8_,local_150._56_8_ + 1);
  }
  if ((undefined1 *)local_150._8_8_ != local_150 + 0x18) {
    operator_delete((void *)local_150._8_8_,local_150._24_8_ + 1);
  }
  cmGeneratorExpression::~cmGeneratorExpression(&local_88);
  return;
}

Assistant:

void cmGeneratorTarget::ExpandLinkItems(std::string const& prop,
                               std::string const& value,
                               std::string const& config,
                               cmGeneratorTarget const* headTarget,
                               bool usage_requirements_only,
                               std::vector<cmLinkItem>& items,
                               bool& hadHeadSensitiveCondition) const
{
  cmGeneratorExpression ge;
  cmGeneratorExpressionDAGChecker dagChecker(this->GetName(), prop, 0, 0);
  // The $<LINK_ONLY> expression may be in a link interface to specify private
  // link dependencies that are otherwise excluded from usage requirements.
  if(usage_requirements_only)
    {
    dagChecker.SetTransitivePropertiesOnly();
    }
  std::vector<std::string> libs;
  cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(value);
  cmSystemTools::ExpandListArgument(cge->Evaluate(
                                      this->LocalGenerator,
                                      config,
                                      false,
                                      headTarget,
                                      this, &dagChecker), libs);
  this->LookupLinkItems(libs, items);
  hadHeadSensitiveCondition = cge->GetHadHeadSensitiveCondition();
}